

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void __thiscall
chrono::turtlebot::TurtleBot::TurtleBot
          (TurtleBot *this,ChSystem *system,ChVector<double> *robot_pos,
          ChQuaternion<double> *robot_rot,shared_ptr<chrono::ChMaterialSurface> *wheel_mat)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChContactMethod contact_method;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  this->m_system = system;
  this->m_dc_motor_control = false;
  (this->m_1st_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_1st_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_1st_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_2nd_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_2nd_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_2nd_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_3rd_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_3rd_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chassis).
  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_chassis).
  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_drive_wheels).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_drive_wheels).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_drive_wheels).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_passive_wheels).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_passive_wheels).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_passive_wheels).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_3rd_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_3rd_level_rods).
  super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_bottom_plate).
  super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_bottom_plate).
  super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_middle_plate).
  super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_middle_plate).
  super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_top_plate).
  super___shared_ptr<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_top_plate).
  super___shared_ptr<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_robot_rot).m_data[0] = robot_rot->m_data[0];
  (this->m_robot_rot).m_data[1] = robot_rot->m_data[1];
  (this->m_robot_rot).m_data[2] = robot_rot->m_data[2];
  (this->m_robot_rot).m_data[3] = robot_rot->m_data[3];
  (this->m_robot_pos).m_data[0] = robot_pos->m_data[0];
  (this->m_robot_pos).m_data[1] = robot_pos->m_data[1];
  (this->m_robot_pos).m_data[2] = robot_pos->m_data[2];
  (this->m_motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_motors_func).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_motors_func).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_motors_func).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_chassis_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_chassis_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (wheel_mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  p_Var1 = (wheel_mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_wheel_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (wheel_mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  (this->m_wheel_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      system = this->m_system;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  contact_method = (**(code **)(*(long *)system + 0x178))(system);
  if (contact_method == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
  }
  DefaultContactMaterial((turtlebot *)&local_48,contact_method);
  p_Var1 = (this->m_chassis_material).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_chassis_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  (this->m_chassis_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_40;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((this->m_wheel_material).
      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    DefaultContactMaterial((turtlebot *)&local_48,contact_method);
    p_Var1 = (this->m_wheel_material).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_wheel_material).
    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    (this->m_wheel_material).
    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Stack_40;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  Create(this);
  return;
}

Assistant:

TurtleBot::TurtleBot(ChSystem* system,
                     const ChVector<>& robot_pos,
                     const ChQuaternion<>& robot_rot,
                     std::shared_ptr<ChMaterialSurface> wheel_mat)
    : m_system(system), m_robot_pos(robot_pos), m_robot_rot(robot_rot), m_wheel_material(wheel_mat) {
    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    auto contact_method = m_system->GetContactMethod();
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials
    m_chassis_material = DefaultContactMaterial(contact_method);
    if (!m_wheel_material)
        m_wheel_material = DefaultContactMaterial(contact_method);

    Create();
}